

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SliceStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_slicestatic(NeuralNetworkLayer *this)

{
  ulong uVar1;
  SliceStaticLayerParams *pSVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x3e3) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3e3;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pSVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SliceStaticLayerParams>(arena);
    (this->layer_).slicestatic_ = pSVar2;
  }
  return (SliceStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceStaticLayerParams* NeuralNetworkLayer::_internal_mutable_slicestatic() {
  if (!_internal_has_slicestatic()) {
    clear_layer();
    set_has_slicestatic();
    layer_.slicestatic_ = CreateMaybeMessage< ::CoreML::Specification::SliceStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.slicestatic_;
}